

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFIXED.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  void *local_18;
  KFIXED<short,_(unsigned_char)__x03_> *this_local;
  
  local_18 = this;
  this_local = (KFIXED<short,_(unsigned_char)__x03_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<short,_(unsigned_char)__x03_> *)this);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(float)KVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString KFIXED<Type, BinaryPoint>::GetAsString() const
{
    KStringStream ss;

    ss << GetAsFloat32() << "\n";

    return ss.str();
}